

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Entity_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_State_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  ostream *poVar3;
  KINT32 Value;
  ulong uVar4;
  pointer pKVar5;
  char cVar6;
  KString local_4c0;
  KString local_4a0;
  KString local_480;
  KString local_460;
  KString local_440;
  KString local_420;
  KString local_400;
  KString local_3e0;
  KString local_3c0;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar2 = std::operator<<(local_1a8,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,"-Entity State PDU-\n");
  poVar3 = std::operator<<(poVar2,"Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_4c0,&this->m_EntityID);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar2 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar2,'\t');
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (local_4c0._M_string_length <= uVar4) break;
    cVar6 = local_4c0._M_dataplus._M_p[uVar4];
    if (local_4c0._M_string_length - 1 != uVar4 && cVar6 == '\n') {
      cVar6 = '\t';
      std::operator<<(poVar2,'\n');
    }
    std::operator<<(poVar2,cVar6);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar2 = std::operator<<(poVar3,local_380);
  poVar2 = std::operator<<(poVar2,"Force ID:                       ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar2 = std::operator<<(poVar2,(string *)local_340);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Variable Params:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumOfVariableParams);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Entity Type:                    ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_3a0,&this->m_EntityType);
  poVar2 = std::operator<<(poVar2,(string *)&local_3a0);
  poVar2 = std::operator<<(poVar2,"Alternative Entity Type:        ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_3c0,&this->m_AltEntityType);
  poVar2 = std::operator<<(poVar2,(string *)&local_3c0);
  poVar2 = std::operator<<(poVar2,"Linear Velocity:                ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_3e0,&this->m_EntityLinearVelocity);
  poVar2 = std::operator<<(poVar2,(string *)&local_3e0);
  poVar2 = std::operator<<(poVar2,"Entity Location:                ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_400,&this->m_EntityLocation);
  poVar2 = std::operator<<(poVar2,(string *)&local_400);
  poVar2 = std::operator<<(poVar2,"Entity Orientation:             ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_420,&this->m_EntityOrientation);
  poVar2 = std::operator<<(poVar2,(string *)&local_420);
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
            (&local_440,&this->m_EntityAppearance,&this->m_EntityType);
  poVar2 = std::operator<<(poVar2,(string *)&local_440);
  DATA_TYPE::DeadReckoningParameter::GetAsString_abi_cxx11_
            (&local_460,&this->m_DeadReckoningParameter);
  poVar2 = std::operator<<(poVar2,(string *)&local_460);
  DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_(&local_480,&this->m_EntityMarking);
  poVar2 = std::operator<<(poVar2,(string *)&local_480);
  DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_(&local_4a0,&this->m_EntityCapabilities);
  std::operator<<(poVar2,(string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_360);
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar5 = (this->m_vVariableParameters).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar5 != pKVar1; pKVar5 = pKVar5 + 1) {
    (*(pKVar5->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Entity_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity State PDU-\n"
       << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Force ID:                       " << GetEnumAsStringForceID( m_ui8ForceID )  << "\n"
       << "Number Of Variable Params:  " << ( KUINT16 )m_ui8NumOfVariableParams << "\n"
       << "Entity Type:                    " << m_EntityType.GetAsString()
       << "Alternative Entity Type:        " << m_AltEntityType.GetAsString()
       << "Linear Velocity:                " << m_EntityLinearVelocity.GetAsString()
       << "Entity Location:                " << m_EntityLocation.GetAsString()
       << "Entity Orientation:             " << m_EntityOrientation.GetAsString()
       << m_EntityAppearance.GetAsString( m_EntityType )
       << m_DeadReckoningParameter.GetAsString()
       << m_EntityMarking.GetAsString()
       << m_EntityCapabilities.GetAsString();

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}